

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dependency_types.cpp
# Opt level: O0

void jaegertracing::thrift::swap(DependencyLink *a,DependencyLink *b)

{
  DependencyLink *b_local;
  DependencyLink *a_local;
  
  std::swap<char,std::char_traits<char>,std::allocator<char>>(&a->parent,&b->parent);
  std::swap<char,std::char_traits<char>,std::allocator<char>>(&a->child,&b->child);
  std::swap<long>(&a->callCount,&b->callCount);
  return;
}

Assistant:

void swap(DependencyLink &a, DependencyLink &b) {
  using ::std::swap;
  swap(a.parent, b.parent);
  swap(a.child, b.child);
  swap(a.callCount, b.callCount);
}